

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void * XML_GetBuffer(XML_Parser parser,int len)

{
  XML_Parsing XVar1;
  char *__dest;
  long local_c0;
  long local_b0;
  bool local_91;
  int local_90;
  int local_88;
  long local_80;
  long local_70;
  int local_60;
  int local_58;
  long local_48;
  int local_34;
  int bufferSize;
  char *newBuf;
  int offset;
  int neededSize;
  int keep;
  int len_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    parser_local = (XML_Parser)0x0;
  }
  else {
    XVar1 = (parser->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      parser->m_errorCode = XML_ERROR_FINISHED;
      parser_local = (XML_Parser)0x0;
    }
    else if (XVar1 == XML_SUSPENDED) {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      parser_local = (XML_Parser)0x0;
    }
    else {
      if ((parser->m_bufferLim == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
        local_48 = 0;
      }
      else {
        local_48 = (long)parser->m_bufferLim - (long)parser->m_bufferEnd;
      }
      if (local_48 < len) {
        if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
          local_58 = 0;
        }
        else {
          local_58 = (int)parser->m_bufferEnd - (int)parser->m_bufferPtr;
        }
        local_58 = len + local_58;
        if (local_58 < 0) {
          parser->m_errorCode = XML_ERROR_NO_MEMORY;
          return (void *)0x0;
        }
        if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
          local_60 = 0;
        }
        else {
          local_60 = (int)parser->m_bufferPtr - (int)parser->m_buffer;
        }
        offset = local_60;
        if (0x400 < local_60) {
          offset = 0x400;
        }
        if (0x7fffffff - local_58 < offset) {
          parser->m_errorCode = XML_ERROR_NO_MEMORY;
          return (void *)0x0;
        }
        if ((parser->m_bufferLim == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
          local_70 = 0;
        }
        else {
          local_70 = (long)parser->m_bufferLim - (long)parser->m_buffer;
        }
        if (local_70 < offset + local_58) {
          if ((parser->m_bufferLim == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
            local_90 = 0;
          }
          else {
            local_90 = (int)parser->m_bufferLim - (int)parser->m_bufferPtr;
          }
          local_34 = local_90;
          if (local_90 == 0) {
            local_34 = 0x400;
          }
          do {
            local_34 = local_34 << 1;
            local_91 = local_34 < offset + local_58 && 0 < local_34;
          } while (local_91);
          if (local_34 < 1) {
            parser->m_errorCode = XML_ERROR_NO_MEMORY;
            return (void *)0x0;
          }
          __dest = (char *)(*(parser->m_mem).malloc_fcn)((long)local_34);
          if (__dest == (char *)0x0) {
            parser->m_errorCode = XML_ERROR_NO_MEMORY;
            return (void *)0x0;
          }
          parser->m_bufferLim = __dest + local_34;
          if (parser->m_bufferPtr == (char *)0x0) {
            parser->m_bufferEnd = __dest;
            parser->m_buffer = __dest;
            parser->m_bufferPtr = __dest;
          }
          else {
            if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
              local_b0 = 0;
            }
            else {
              local_b0 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
            }
            memcpy(__dest,parser->m_bufferPtr + -offset,local_b0 + offset);
            (*(parser->m_mem).free_fcn)(parser->m_buffer);
            parser->m_buffer = __dest;
            if ((parser->m_bufferEnd == (char *)0x0) || (parser->m_bufferPtr == (char *)0x0)) {
              local_c0 = 0;
            }
            else {
              local_c0 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
            }
            parser->m_bufferEnd = parser->m_buffer + offset + local_c0;
            parser->m_bufferPtr = parser->m_buffer + offset;
          }
        }
        else {
          if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
            local_80 = 0;
          }
          else {
            local_80 = (long)parser->m_bufferPtr - (long)parser->m_buffer;
          }
          if (offset < local_80) {
            if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
              local_88 = 0;
            }
            else {
              local_88 = (int)parser->m_bufferPtr - (int)parser->m_buffer;
            }
            local_88 = local_88 - offset;
            memmove(parser->m_buffer,parser->m_buffer + local_88,
                    (size_t)(parser->m_bufferEnd + ((long)offset - (long)parser->m_bufferPtr)));
            parser->m_bufferEnd = parser->m_bufferEnd + -(long)local_88;
            parser->m_bufferPtr = parser->m_bufferPtr + -(long)local_88;
          }
        }
        parser->m_eventEndPtr = (char *)0x0;
        parser->m_eventPtr = (char *)0x0;
        parser->m_positionPtr = (char *)0x0;
      }
      parser_local = (XML_Parser)parser->m_bufferEnd;
    }
  }
  return parser_local;
}

Assistant:

void *XMLCALL
XML_GetBuffer(XML_Parser parser, int len) {
  if (parser == NULL)
    return NULL;
  if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return NULL;
  }
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return NULL;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return NULL;
  default:;
  }

  if (len > EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd)) {
#ifdef XML_CONTEXT_BYTES
    int keep;
#endif /* defined XML_CONTEXT_BYTES */
    /* Do not invoke signed arithmetic overflow: */
    int neededSize = (int)((unsigned)len
                           + (unsigned)EXPAT_SAFE_PTR_DIFF(
                               parser->m_bufferEnd, parser->m_bufferPtr));
    if (neededSize < 0) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
#ifdef XML_CONTEXT_BYTES
    keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    /* Detect and prevent integer overflow */
    if (keep > INT_MAX - neededSize) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
    neededSize += keep;
#endif /* defined XML_CONTEXT_BYTES */
    if (neededSize
        <= EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_buffer)) {
#ifdef XML_CONTEXT_BYTES
      if (keep < EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)) {
        int offset
            = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)
              - keep;
        /* The buffer pointers cannot be NULL here; we have at least some bytes
         * in the buffer */
        memmove(parser->m_buffer, &parser->m_buffer[offset],
                parser->m_bufferEnd - parser->m_bufferPtr + keep);
        parser->m_bufferEnd -= offset;
        parser->m_bufferPtr -= offset;
      }
#else
      if (parser->m_buffer && parser->m_bufferPtr) {
        memmove(parser->m_buffer, parser->m_bufferPtr,
                EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
        parser->m_bufferPtr = parser->m_buffer;
      }
#endif /* not defined XML_CONTEXT_BYTES */
    } else {
      char *newBuf;
      int bufferSize
          = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferPtr);
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        /* Do not invoke signed arithmetic overflow: */
        bufferSize = (int)(2U * (unsigned)bufferSize);
      } while (bufferSize < neededSize && bufferSize > 0);
      if (bufferSize <= 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      newBuf = (char *)MALLOC(parser, bufferSize);
      if (newBuf == 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      parser->m_bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (parser->m_bufferPtr) {
        memcpy(newBuf, &parser->m_bufferPtr[-keep],
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
                   + keep);
        FREE(parser, parser->m_buffer);
        parser->m_buffer = newBuf;
        parser->m_bufferEnd
            = parser->m_buffer
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr)
              + keep;
        parser->m_bufferPtr = parser->m_buffer + keep;
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
        parser->m_bufferPtr = parser->m_buffer = newBuf;
      }
#else
      if (parser->m_bufferPtr) {
        memcpy(newBuf, parser->m_bufferPtr,
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        FREE(parser, parser->m_buffer);
        parser->m_bufferEnd
            = newBuf
              + EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
      } else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
      }
      parser->m_bufferPtr = parser->m_buffer = newBuf;
#endif /* not defined XML_CONTEXT_BYTES */
    }
    parser->m_eventPtr = parser->m_eventEndPtr = NULL;
    parser->m_positionPtr = NULL;
  }
  return parser->m_bufferEnd;
}